

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O0

int big_file_mpi_broadcast_anyerror(int rt,MPI_Comm comm)

{
  size_t sVar1;
  int local_34;
  char *pcStack_30;
  int errorlen;
  char *error;
  int local_20;
  int loc;
  int root;
  int rank;
  MPI_Comm comm_local;
  int rt_local;
  
  _root = comm;
  comm_local._0_4_ = rt;
  MPI_Comm_rank(comm,&loc);
  error._4_4_ = 0;
  if ((int)comm_local != 0) {
    error._4_4_ = loc + 1;
  }
  MPI_Allreduce((long)&error + 4,&local_20,1,&ompi_mpi_int,&ompi_mpi_op_max,_root);
  if (local_20 == 0) {
    comm_local._4_4_ = 0;
  }
  else {
    local_20 = local_20 + -1;
    pcStack_30 = big_file_get_error_message();
    if (loc == local_20) {
      sVar1 = strlen(pcStack_30);
      local_34 = (int)sVar1;
    }
    MPI_Bcast(&local_34,1,&ompi_mpi_int,local_20,_root);
    if (loc != local_20) {
      pcStack_30 = (char *)malloc((long)(local_34 + 1));
    }
    MPI_Bcast(pcStack_30,local_34 + 1,&ompi_mpi_byte,local_20,_root);
    if (loc != local_20) {
      big_file_set_error_message(pcStack_30);
      free(pcStack_30);
    }
    MPI_Bcast(&comm_local,1,&ompi_mpi_int,local_20,_root);
    comm_local._4_4_ = (int)comm_local;
  }
  return comm_local._4_4_;
}

Assistant:

static int
big_file_mpi_broadcast_anyerror(int rt, MPI_Comm comm)
{
    int rank;
    MPI_Comm_rank(comm, &rank);
    int root, loc = 0;
    /* Add 1 so we do not swallow errors on rank 0*/
    if(rt != 0)
        loc = rank+1;

    MPI_Allreduce(&loc, &root, 1, MPI_INT, MPI_MAX, comm);

    if (root == 0) {
        /* no errors */
        return 0;
    }

    root -= 1;
    char * error = big_file_get_error_message();

    int errorlen;
    if(rank == root) {
        errorlen = strlen(error);
    }
    MPI_Bcast(&errorlen, 1, MPI_INT, root, comm);

    if(rank != root) {
        error = malloc(errorlen + 1);
    }

    MPI_Bcast(error, errorlen + 1, MPI_BYTE, root, comm);

    if(rank != root) {
        big_file_set_error_message(error);
        free(error);
    }

    MPI_Bcast(&rt, 1, MPI_INT, root, comm);

    return rt;
}